

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utilities.c
# Opt level: O0

size_t StringUtilities_code_point_length_for_part(wchar_t *string,wchar_t length)

{
  _Bool _Var1;
  wchar_t local_1c;
  int local_18;
  wchar_t i;
  wchar_t code_points;
  wchar_t length_local;
  wchar_t *string_local;
  
  local_18 = 0;
  for (local_1c = L'\0'; local_1c < length; local_1c = local_1c + L'\x01') {
    local_18 = local_18 + 1;
    _Var1 = UnicodeUtilities_is_utf16_surrogate(string[local_1c]);
    if (_Var1) {
      local_1c = local_1c + L'\x01';
    }
  }
  return (long)local_18;
}

Assistant:

size_t StringUtilities_code_point_length_for_part(const wchar_t* string, const int length) {
    int code_points = 0;
    int i;
    for (i = 0; i < length; ++i) {
        ++code_points;
        if (UnicodeUtilities_is_utf16_surrogate(string[i])) {
            ++i;
        }

    }
    return code_points;
}